

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O3

BrandTypeIterator * __thiscall
wasm::anon_unknown_0::BrandTypeIterator::operator++(BrandTypeIterator *this)

{
  pointer pFVar1;
  pointer pFVar2;
  ulong uVar3;
  FieldInfo *pFVar4;
  pointer pFVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  FieldInfo *pFVar10;
  bool bVar11;
  
  pFVar1 = (this->fields).
           super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->fields).
           super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pFVar2 - (long)pFVar1;
  uVar3 = lVar9 >> 1;
  uVar6 = uVar3 & 0xffffffff;
  while( true ) {
    bVar11 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    if (bVar11) {
      if (this->useArray == true) {
        this->useArray = false;
        return this;
      }
      if (pFVar2 == (this->fields).
                    super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar9 == 0x7ffffffffffffffe) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar6 = 1;
        if (pFVar2 != pFVar1) {
          uVar6 = uVar3;
        }
        uVar8 = uVar6 + uVar3;
        if (0x3ffffffffffffffe < uVar8) {
          uVar8 = 0x3fffffffffffffff;
        }
        if (CARRY8(uVar6,uVar3)) {
          uVar8 = 0x3fffffffffffffff;
        }
        pFVar4 = (FieldInfo *)operator_new(uVar8 * 2);
        *(undefined2 *)((long)pFVar4 + lVar9) = 0;
        pFVar10 = pFVar4;
        for (pFVar5 = pFVar1; pFVar2 != pFVar5; pFVar5 = pFVar5 + 1) {
          *pFVar10 = *pFVar5;
          pFVar10 = pFVar10 + 1;
        }
        pFVar10 = pFVar10 + 1;
        if (pFVar1 != (pointer)0x0) {
          operator_delete(pFVar1,(long)(this->fields).
                                       super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pFVar1);
        }
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pFVar4;
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar10;
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar4 + uVar8;
      }
      else {
        pFVar2->index = '\0';
        pFVar2->immutable = false;
        pFVar4 = (this->fields).
                 super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar10 = (this->fields).
                  super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar10;
      }
      this->useArray = (long)pFVar10 - (long)pFVar4 == 2;
      return this;
    }
    if (pFVar1[uVar6].immutable == false) break;
    iVar7 = (uint)pFVar1[uVar6].index + ((pFVar1[uVar6].index + 1) / 9 & 0xfffffffe) * -9 + 1;
    pFVar1[uVar6].index = (uint8_t)iVar7;
    pFVar1[uVar6].immutable = false;
    if ((short)iVar7 != 0) {
      return this;
    }
  }
  pFVar1[uVar6].immutable = true;
  return this;
}

Assistant:

BrandTypeIterator& operator++() {
    for (Index i = fields.size(); i > 0; --i) {
      if (fields[i - 1].advance()) {
        return *this;
      }
    }
    if (useArray) {
      useArray = false;
      return *this;
    }
    fields.emplace_back();
    useArray = fields.size() == 1;
    return *this;
  }